

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Subtract(SubtractForm1 Subtract)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  byte *pbVar6;
  code *in_RDI;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t value;
  uint in_stack_ffffffffffffff40;
  undefined2 uVar7;
  uint8_t in_stack_ffffffffffffff46;
  undefined1 uVar8;
  uint8_t in_stack_ffffffffffffff47;
  undefined1 uVar9;
  uint32_t in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  byte bVar10;
  undefined1 in_stack_ffffffffffffff4f;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> *image1;
  undefined1 local_98 [96];
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  Image *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  value = (uint8_t)(in_stack_ffffffffffffff3c >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,
             CONCAT13(in_stack_ffffffffffffff4f,
                      CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46);
  Test_Helper::uniformImages(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e3970);
  image1 = (ImageTemplate<unsigned_char> *)&local_38;
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)image1,0);
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)image1,1);
  (*in_RDI)(local_98,pvVar4,pvVar5);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_38,0);
  bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (image1,(ImageTemplate<unsigned_char> *)
                            CONCAT17(in_stack_ffffffffffffff4f,
                                     CONCAT16(in_stack_ffffffffffffff4e,
                                              CONCAT24(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48))));
  bVar10 = false;
  if (bVar1) {
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffffe0,0);
    uVar2 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffffe0,1);
    if ((int)(uint)*pbVar6 < (int)uVar2) {
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xffffffffffffffe0,0);
      in_stack_ffffffffffffff40 = (uint)*pbVar6;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xffffffffffffffe0,1);
      iVar3 = in_stack_ffffffffffffff40 - *pbVar6;
      uVar7 = (undefined2)iVar3;
      uVar8 = (undefined1)((uint)iVar3 >> 0x10);
      uVar9 = (undefined1)((uint)iVar3 >> 0x18);
    }
    else {
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
    }
    bVar10 = Unit_Test::verifyImage
                       ((Image *)CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(uVar7,
                                                  in_stack_ffffffffffffff40))),value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e3aa4);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)image1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image1);
  return (bool)(bVar10 & 1);
}

Assistant:

bool form1_Subtract(SubtractForm1 Subtract)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = Subtract( input[0], input[1] );

        return equalSize( input[0], output ) &&
            verifyImage( output, static_cast<uint8_t>( intensity[0] > intensity[1] ? intensity[0] - intensity[1] : 0u ) );
    }